

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::PointerBuilder::initList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          ElementCount elementCount)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  BuilderArena *this_00;
  ulong uVar1;
  word *pwVar2;
  uint amount;
  ulong uVar3;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  StructDataBitCount local_44;
  CapTableBuilder *local_40;
  ulong local_38;
  
  ref = this->pointer;
  segment = this->segment;
  AVar4.words = (word *)ref;
  AVar4.segment = segment;
  local_40 = this->capTable;
  if (0x1fffffff < elementCount) {
    ::anon_func::anon_class_1_0_00000001::operator()(&local_46);
  }
  local_44 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (uint)elementSize * 4);
  local_38 = (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (uint)elementSize * 4);
  uVar3 = elementCount * local_38 + 0x3f >> 6;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,local_40,ref);
  }
  pwVar2 = segment->pos;
  uVar1 = uVar3 & 0xffffffff;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar2)) >> 3 < (long)uVar1) ||
     (segment->pos = pwVar2 + uVar1, pwVar2 == (word *)0x0)) {
    amount = (int)uVar3 + 1;
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    if (0x1fffffff < amount) {
      WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_45);
    }
    AVar4 = BuilderArena::allocate(this_00,amount);
    (ref->offsetAndKind).value =
         (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar4.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar4.words)->content = 1;
    pwVar2 = AVar4.words + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pwVar2 - (long)ref) >> 1) & 0xfffffffc) - 3;
  }
  *(ElementCount *)((long)&(AVar4.words)->content + 4) = elementCount * 8 | (uint)elementSize;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = local_40;
  __return_storage_ptr__->ptr = (byte *)pwVar2;
  __return_storage_ptr__->elementCount = elementCount;
  __return_storage_ptr__->step = (BitsPerElementN<23>)local_38;
  __return_storage_ptr__->structDataSize = local_44;
  __return_storage_ptr__->structPointerCount = (ushort)(elementSize == POINTER);
  __return_storage_ptr__->elementSize = elementSize;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initList(ElementSize elementSize, ElementCount elementCount) {
  return WireHelpers::initListPointer(pointer, segment, capTable, elementCount, elementSize);
}